

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

bool __thiscall Minisat::OnlineProofChecker::propagate(OnlineProofChecker *this)

{
  Lit *pLVar1;
  anon_struct_8_10_eb538618_for_header *cls;
  Lit p_00;
  int iVar2;
  bool bVar3;
  ostream *poVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  uint *puVar8;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *this_00;
  int i;
  long lVar9;
  undefined8 *puVar10;
  uint *puVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  ulong uVar15;
  ulong uVar16;
  Lit *val;
  lbool local_79;
  Watcher local_78;
  Lit first;
  Lit p;
  Lit blocker;
  
  this_00 = (OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted> *)
            (this + 0x58);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::cleanAll(this_00)
  ;
  if (3 < *(int *)(this + 0xf8)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ... ");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (4 < *(int *)(this + 0xf8)) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(this + 0x38));
      poVar4 = std::operator<<(poVar4," units");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
  }
  for (lVar9 = 0; lVar9 < *(int *)(this + 0x38); lVar9 = lVar9 + 1) {
    p_00.x = *(int *)(*(long *)(this + 0x30) + lVar9 * 4);
    bVar6 = (byte)p_00.x & 1;
    local_78.cref =
         CONCAT31(local_78.cref._1_3_,
                  *(byte *)(*(long *)(this + 0xd8) + (long)(p_00.x >> 1)) ^ bVar6);
    bVar3 = lbool::operator==((lbool *)&local_78,(lbool)0x0);
    if (!bVar3) {
      local_78.cref =
           CONCAT31(local_78.cref._1_3_,
                    bVar6 ^ *(byte *)(*(long *)(this + 0xd8) + (long)(p_00.x >> 1)));
      bVar3 = lbool::operator==((lbool *)&local_78,(lbool)0x1);
      if (bVar3) {
        return true;
      }
      uncheckedEnqueue(this,p_00);
    }
  }
  uVar7 = 0xffffffff;
  do {
    iVar2 = *(int *)(this + 0xb0);
    if (*(int *)(this + 0xc0) <= iVar2) {
      if (5 < *(int *)(this + 0xf8)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate returns ");
        poVar4 = std::ostream::_M_insert<bool>(SUB81(poVar4,0));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      return uVar7 != 0xffffffff;
    }
    *(int *)(this + 0xb0) = iVar2 + 1;
    p.x = *(int *)(*(long *)(this + 0xb8) + (long)iVar2 * 4);
    if (*(int *)(this + 0xf8) < 6) {
      puVar10 = (undefined8 *)((long)p.x * 0x10 + *(long *)this_00);
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate lit ");
      poVar4 = operator<<(poVar4,&p);
      std::endl<char,std::char_traits<char>>(poVar4);
      puVar10 = (undefined8 *)((long)p.x * 0x10 + *(long *)(this + 0x58));
      if (6 < *(int *)(this + 0xf8)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with ");
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,*(int *)(puVar10 + 1));
        poVar4 = std::operator<<(poVar4," longer clauses");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
    }
    puVar14 = (uint *)*puVar10;
    puVar8 = puVar14 + (long)*(int *)(puVar10 + 1) * 2;
    puVar11 = puVar14;
LAB_0010b358:
    puVar12 = puVar8;
    uVar5 = uVar7;
    if (puVar11 != puVar8) {
      if (7 < *(int *)(this + 0xf8)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] propagate with clause ");
        poVar4 = operator<<(poVar4,(Clause *)((ulong)*puVar11 * 4 + *(long *)(this + 8)));
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      blocker.x = puVar11[1];
      local_78.cref =
           CONCAT31(local_78.cref._1_3_,
                    (byte)blocker.x & 1 ^ *(byte *)(*(long *)(this + 0xd8) + (long)(blocker.x >> 1))
                   );
      bVar3 = lbool::operator==((lbool *)&local_78,(lbool)0x0);
      if (bVar3) {
        if (8 < *(int *)(this + 0xf8)) {
          poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] clause is true by blocker ")
          ;
          poVar4 = operator<<(poVar4,&blocker);
          poVar4 = std::operator<<(poVar4," in ");
          poVar4 = operator<<(poVar4,(Clause *)((ulong)*puVar11 * 4 + *(long *)(this + 8)));
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        *(undefined8 *)puVar14 = *(undefined8 *)puVar11;
        puVar14 = puVar14 + 2;
        puVar11 = puVar11 + 2;
      }
      else {
        uVar5 = *puVar11;
        uVar15 = (ulong)uVar5;
        lVar9 = *(long *)(this + 8);
        cls = (anon_struct_8_10_eb538618_for_header *)(lVar9 + uVar15 * 4);
        uVar13 = p.x ^ 1;
        local_78.blocker.x = *(int *)&cls[1].field_0x0;
        if (local_78.blocker.x == uVar13) {
          local_78.blocker.x = *(int *)&cls[1].field_0x4;
          *(int *)&cls[1].field_0x0 = local_78.blocker.x;
          *(uint *)&cls[1].field_0x4 = uVar13;
        }
        puVar12 = puVar11 + 2;
        local_78.cref = uVar5;
        first.x = local_78.blocker.x;
        puVar11 = puVar12;
        if (local_78.blocker.x == blocker.x) {
LAB_0010b505:
          val = (Lit *)(lVar9 + uVar15 * 4 + 0xc);
          uVar16 = 2;
LAB_0010b516:
          if (uVar16 < (ulong)*cls >> 0x22) break;
          *(ulong *)puVar14 = CONCAT44(local_78.blocker.x,local_78.cref);
          puVar14 = puVar14 + 2;
          local_79.value =
               (byte)first.x & 1 ^ *(byte *)(*(long *)(this + 0xd8) + (long)(first.x >> 1));
          bVar3 = lbool::operator==(&local_79,(lbool)0x1);
          if (bVar3) {
            *(undefined4 *)(this + 0xb0) = *(undefined4 *)(this + 0xc0);
            for (; puVar12 < puVar8; puVar12 = puVar12 + 2) {
              *(undefined8 *)puVar14 = *(undefined8 *)puVar12;
              puVar14 = puVar14 + 2;
            }
            goto LAB_0010b6a1;
          }
          if (8 < *(int *)(this + 0xf8)) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] enqueue ");
            poVar4 = operator<<(poVar4,&first);
            poVar4 = std::operator<<(poVar4," with reason ");
            poVar4 = operator<<(poVar4,(Clause *)(uVar15 * 4 + *(long *)(this + 8)));
            std::endl<char,std::char_traits<char>>(poVar4);
          }
          uncheckedEnqueue(this,first);
          goto LAB_0010b358;
        }
        local_79.value =
             (byte)local_78.blocker.x & 1 ^
             *(byte *)(*(long *)(this + 0xd8) + (long)(local_78.blocker.x >> 1));
        bVar3 = lbool::operator==(&local_79,(lbool)0x0);
        if (!bVar3) goto LAB_0010b505;
        if (8 < *(int *)(this + 0xf8)) {
          poVar4 = std::operator<<((ostream *)&std::cerr,
                                   "c [DRAT-OTFC] clause is true by other watch ");
          poVar4 = operator<<(poVar4,&first);
          poVar4 = std::operator<<(poVar4," in ");
          poVar4 = operator<<(poVar4,(Clause *)cls);
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        *(ulong *)puVar14 = CONCAT44(local_78.blocker.x,local_78.cref);
        puVar14 = puVar14 + 2;
      }
      goto LAB_0010b358;
    }
LAB_0010b6a1:
    *(int *)(puVar10 + 1) =
         *(int *)(puVar10 + 1) - (int)((ulong)((long)puVar12 - (long)puVar14) >> 3);
    uVar7 = uVar5;
  } while( true );
  pLVar1 = val + 1;
  val = val + 1;
  local_79.value = (byte)pLVar1->x & 1 ^ *(byte *)(*(long *)(this + 0xd8) + (long)(pLVar1->x >> 1));
  bVar3 = lbool::operator!=(&local_79,(lbool)0x1);
  uVar16 = uVar16 + 1;
  if (bVar3) goto code_r0x0010b55a;
  goto LAB_0010b516;
code_r0x0010b55a:
  if (8 < *(int *)(this + 0xf8)) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] found new watch for the clause: ")
    ;
    poVar4 = operator<<(poVar4,val);
    poVar4 = std::operator<<(poVar4," in ");
    poVar4 = operator<<(poVar4,(Clause *)cls);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  *(int *)&cls[1].field_0x4 = val->x;
  val->x = uVar13;
  vec<Minisat::Watcher>::push
            ((vec<Minisat::Watcher> *)
             (((long)*(int *)&cls[1].field_0x4 ^ 1U) * 0x10 + *(long *)this_00),&local_78);
  goto LAB_0010b358;
}

Assistant:

inline bool OnlineProofChecker::propagate()
{
    CRef confl = CRef_Undef;
    int num_props = 0;
    watches.cleanAll();

    DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] propagate ... " << std::endl;);

    // propagate units first!
    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] propagate " << unitClauses.size() << " units" << std::endl;);
    for (int i = 0; i < unitClauses.size(); ++i) { // propagate all known units
        const Lit l = unitClauses[i];
        if (value(l) == l_True) {
            continue;
        } else if (value(l) == l_False) {
            return true;
        } else {
            uncheckedEnqueue(l);
        }
    }


    while (qhead < trail.size()) {
        Lit p = trail[qhead++]; // 'p' is enqueued fact to propagate.
        num_props++;
        DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate lit " << p << std::endl;);

        vec<Watcher> &ws = watches[p];
        DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] propagate with " << ws.size() << " longer clauses" << std::endl;);
        Watcher *i, *j, *end;
        // propagate longer clauses here!
        for (i = j = (Watcher *)ws, end = i + ws.size(); i != end;) {
            DOUT(if (verbose > 7) std::cerr << "c [DRAT-OTFC] propagate with clause " << ca[i->cref] << std::endl;);

            // Try to avoid inspecting the clause:
            const Lit blocker = i->blocker;
            if (value(blocker) == l_True) { // keep binary clauses, and clauses where the blocking literal is satisfied
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by blocker " << blocker << " in "
                                                << ca[i->cref] << std::endl;);
                *j++ = *i++;
                continue;
            }

            // Make sure the false literal is data[1]:
            const CRef cr = i->cref;
            Clause &c = ca[cr];
            const Lit false_lit = ~p;
            if (c[0] == false_lit) {
                c[0] = c[1], c[1] = false_lit;
            }
            assert(c[1] == false_lit && "wrong literal order in the clause!");
            i++;

            // If 0th watch is true, then clause is already satisfied.
            Lit first = c[0];
            const Watcher &w = Watcher(cr, first);            // updates the blocking literal
            if (first != blocker && value(first) == l_True) { // satisfied clause
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] clause is true by other watch " << first << " in "
                                                << c << std::endl;);
                *j++ = w;
                continue;
            } // same as goto NextClause;

            // Look for new watch:
            for (int k = 2; k < c.size(); k++)
                if (value(c[k]) != l_False) {
                    DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] found new watch for the clause: " << c[k]
                                                    << " in " << c << std::endl;);
                    c[1] = c[k];
                    c[k] = false_lit;
                    watches[~c[1]].push(w);
                    goto NextClause;
                } // no need to indicate failure of lhbr, because remaining code is skipped in this case!

            // Did not find watch -- clause is unit under assignment:
            *j++ = w;
            if (value(first) == l_False) {
                confl = cr;
                qhead = trail.size();
                // Copy the remaining watches:
                while (i < end) {
                    *j++ = *i++;
                }
                break;
            } else {
                DOUT(if (verbose > 8) std::cerr << "c [DRAT-OTFC] enqueue " << first << " with reason " << ca[cr] << std::endl;);
                uncheckedEnqueue(first);
            }
        NextClause:;
        }
        ws.shrink_(i - j); // remove all duplciate clauses!
    }
    DOUT(if (verbose > 5) std::cerr << "c [DRAT-OTFC] propagate returns " << (confl != CRef_Undef) << std::endl;);
    return (confl != CRef_Undef); // return true, if something was found!
}